

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  size_t *psVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  void *pvVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  ushort uVar25;
  short sVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  size_t *psVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  char cVar43;
  size_t key_1;
  long lVar44;
  ulong uVar45;
  int *piVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ushort uVar50;
  ulong uVar51;
  ulong uVar52;
  bool bVar53;
  ulong local_150;
  int *local_148;
  int *local_140;
  ulong local_138;
  ulong local_118;
  ulong local_108;
  ulong local_e0;
  ulong local_c8;
  size_t *local_b8;
  ulong local_b0;
  ulong local_a0;
  
  uVar4 = (position - 3) + num_bytes;
  sVar27 = position;
  if (3 < num_bytes) {
    sVar27 = uVar4;
  }
  lVar44 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar44 = 0x40;
  }
  local_118 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 4) {
    local_b8 = last_insert_len;
LAB_0010991c:
    *(ulong *)dist_cache = (local_118 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_b8 - (long)last_insert_len >> 4);
    return;
  }
  uVar32 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  lVar7 = *(long *)(literal_context_lut + 0x10);
  local_150 = lVar44 + position;
  lVar3 = position - 1;
  local_b8 = last_insert_len;
  uVar35 = position;
LAB_00107e50:
  uVar19 = uVar1 - uVar35;
  uVar21 = uVar32;
  if (uVar35 < uVar32) {
    uVar21 = uVar35;
  }
  local_a0 = lVar7 + uVar35;
  if (uVar32 <= lVar7 + uVar35) {
    local_a0 = uVar32;
  }
  uVar14 = *(ulong *)(literal_context_lut + 0x50);
  lVar28 = *(long *)&params->dist;
  uVar42 = uVar35 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar42);
  iVar11 = *(int *)(ringbuffer + uVar42);
  psVar37 = *(size_t **)backward_references;
  if (back_refs_position <= psVar37) {
    bVar53 = false;
    bVar9 = back_refs_position == (size_t *)0x0;
LAB_00107feb:
    uVar38 = (uint)(iVar11 * 0x1e35a7bd) >> 0x11;
    uVar51 = (ulong)uVar38;
    uVar36 = (ulong)((uint)uVar19 & 7);
    uVar34 = uVar19 & 0xfffffffffffffff8;
    local_108 = 0x7e4;
    uVar20 = 0;
    lVar31 = 0;
    local_e0 = 0;
    local_c8 = 0;
    do {
      uVar15 = (ulong)*(int *)((long)&(hasher->common).extra + lVar31 * 4);
      uVar22 = uVar35 - uVar15;
      cVar43 = (char)uVar38;
      if ((((lVar31 == 0) || (*(char *)(lVar28 + 0x30000 + (uVar22 & 0xffff)) == cVar43)) &&
          (uVar15 <= uVar21)) && (uVar22 < uVar35)) {
        if (7 < uVar19) {
          lVar48 = 0;
          uVar45 = 0;
LAB_001080b0:
          if (*(ulong *)(piVar2 + uVar45 * 2) ==
              *(ulong *)(ringbuffer + uVar45 * 8 + (uVar22 & ringbuffer_mask)))
          goto code_r0x001080c2;
          uVar45 = *(ulong *)(ringbuffer + uVar45 * 8 + (uVar22 & ringbuffer_mask)) ^
                   *(ulong *)(piVar2 + uVar45 * 2);
          uVar22 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar45 = (uVar22 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_0010810a;
        }
        piVar46 = piVar2;
        uVar49 = 0;
LAB_0010819d:
        uVar45 = uVar49;
        if (uVar36 != 0) {
          uVar52 = uVar36 | uVar49;
          uVar23 = uVar36;
          do {
            uVar45 = uVar49;
            if (ringbuffer[uVar49 + (uVar22 & ringbuffer_mask)] != (uint8_t)*piVar46) break;
            piVar46 = (int *)((long)piVar46 + 1);
            uVar49 = uVar49 + 1;
            uVar23 = uVar23 - 1;
            uVar45 = uVar52;
          } while (uVar23 != 0);
        }
LAB_0010810a:
        if ((bVar53) &&
           (uVar22 = (ulong)(int)num_literals[(long)psVar37 * 2], uVar22 < uVar45 + uVar35)) {
          uVar45 = uVar22 - uVar35;
        }
        if ((1 < uVar45) && (uVar22 = uVar45 * 0x87 + 0x78f, local_108 < uVar22)) {
          if (lVar31 != 0) {
            uVar22 = uVar22 - ((0x1ca10U >> ((byte)lVar31 & 2) & 4) + 0x27);
          }
          if (local_108 < uVar22) {
            uVar20 = uVar45;
            local_108 = uVar22;
            local_e0 = uVar45;
            local_c8 = uVar15;
          }
        }
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != 4);
    lVar31 = *(long *)&(params->hasher).num_last_distances_to_check;
    uVar22 = uVar35 - *(uint *)(lVar28 + uVar51 * 4);
    uVar25 = *(ushort *)(lVar28 + 0x20000 + uVar51 * 2);
    if (lVar31 != 0) {
      uVar45 = 0;
      uVar15 = uVar22;
      uVar50 = uVar25;
      do {
        uVar45 = uVar15 + uVar45;
        if (uVar21 < uVar45) break;
        if (uVar42 + uVar20 <= ringbuffer_mask) {
          uVar15 = uVar35 - uVar45 & ringbuffer_mask;
          if ((uVar15 + uVar20 <= ringbuffer_mask) &&
             (ringbuffer[uVar42 + uVar20] == ringbuffer[uVar15 + uVar20])) {
            if (7 < uVar19) {
              lVar48 = 0;
              uVar49 = 0;
LAB_0010825f:
              if (*(ulong *)(piVar2 + uVar49 * 2) == *(ulong *)(ringbuffer + uVar49 * 8 + uVar15))
              goto code_r0x00108271;
              uVar49 = *(ulong *)(ringbuffer + uVar49 * 8 + uVar15) ^
                       *(ulong *)(piVar2 + uVar49 * 2);
              uVar15 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar49 = (uVar15 >> 3 & 0x1fffffff) - lVar48;
              goto LAB_001082ce;
            }
            piVar46 = piVar2;
            uVar23 = 0;
LAB_00108338:
            uVar49 = uVar23;
            if (uVar36 != 0) {
              uVar47 = uVar36 | uVar23;
              uVar52 = uVar36;
              do {
                uVar49 = uVar23;
                if (ringbuffer[uVar23 + uVar15] != (uint8_t)*piVar46) break;
                piVar46 = (int *)((long)piVar46 + 1);
                uVar23 = uVar23 + 1;
                uVar52 = uVar52 - 1;
                uVar49 = uVar47;
              } while (uVar52 != 0);
            }
LAB_001082ce:
            if ((bVar53) &&
               (uVar15 = (ulong)(int)num_literals[(long)psVar37 * 2], uVar15 < uVar49 + uVar35)) {
              uVar49 = uVar15 - uVar35;
            }
            if (3 < uVar49) {
              iVar11 = 0x1f;
              if ((uint)uVar45 != 0) {
                for (; (uint)uVar45 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                }
              }
              uVar15 = (ulong)(iVar11 * -0x1e + 0x780) + uVar49 * 0x87;
              if (local_108 < uVar15) {
                uVar20 = uVar49;
                local_108 = uVar15;
                local_e0 = uVar49;
                local_c8 = uVar45;
              }
            }
          }
        }
        uVar15 = (ulong)uVar50;
        uVar50 = *(ushort *)(lVar28 + 0x40002 + uVar15 * 4);
        uVar15 = (ulong)*(ushort *)(lVar28 + 0x40000 + uVar15 * 4);
        lVar31 = lVar31 + -1;
      } while (lVar31 != 0);
    }
    uVar50 = (ushort)(params->hasher).block_bits;
    *(ushort *)&(params->hasher).block_bits = uVar50 + 1;
    *(char *)(lVar28 + 0x30000 + (uVar35 & 0xffff)) = cVar43;
    if (0xfffe < uVar22) {
      uVar22 = 0xffff;
    }
    *(short *)(lVar28 + 0x40000 + (ulong)uVar50 * 4) = (short)uVar22;
    *(ushort *)(lVar28 + 0x40002 + (ulong)uVar50 * 4) = uVar25;
    *(int *)(lVar28 + uVar51 * 4) = (int)uVar35;
    *(ushort *)(lVar28 + 0x20000 + uVar51 * 2) = uVar50;
    if (local_108 != 0x7e4) {
      iVar11 = 0;
      bVar53 = true;
      goto LAB_00108624;
    }
    if (!bVar9) {
      psVar37 = *(size_t **)backward_references;
      goto LAB_00109022;
    }
    lVar28 = *(long *)&(params->dist).alphabet_size_max;
    uVar21 = *(ulong *)(lVar28 + 8);
    local_138 = *(ulong *)(lVar28 + 0x10);
    bVar9 = true;
    if (uVar21 >> 7 <= local_138) {
      uVar42 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      lVar31 = *(long *)(literal_context_lut + 0x78);
      iVar11 = 0;
      local_108 = 0x7e4;
      bVar53 = true;
LAB_0010845b:
      uVar21 = uVar21 + 1;
      *(ulong *)(lVar28 + 8) = uVar21;
      bVar18 = *(byte *)(lVar31 + uVar42);
      uVar20 = (ulong)bVar18;
      if ((uVar20 != 0) && (uVar20 <= uVar19)) {
        uVar36 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar42 * 2);
        lVar48 = *(long *)(literal_context_lut + 0x58);
        pcVar24 = (char *)(uVar36 * uVar20 + *(long *)(lVar48 + 0xa8) +
                          (ulong)*(uint *)(lVar48 + 0x20 + uVar20 * 4));
        if (7 < bVar18) {
          uVar51 = (ulong)(bVar18 & 0xfffffff8);
          lVar33 = 0;
          uVar34 = 0;
LAB_001084b8:
          if (*(ulong *)(pcVar24 + uVar34 * 8) == *(ulong *)(piVar2 + uVar34 * 2))
          goto code_r0x001084ca;
          uVar51 = *(ulong *)(piVar2 + uVar34 * 2) ^ *(ulong *)(pcVar24 + uVar34 * 8);
          uVar34 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          uVar34 = (uVar34 >> 3 & 0x1fffffff) - lVar33;
          goto LAB_00108500;
        }
        uVar51 = 0;
        goto LAB_001085d9;
      }
      goto LAB_001085be;
    }
    goto LAB_00108f28;
  }
  uVar20 = (ulong)(int)num_literals[(long)psVar37 * 2];
  if (uVar20 < uVar35) {
    psVar13 = num_literals + (long)psVar37 * 2;
    do {
      psVar37 = (size_t *)((long)psVar37 + 1);
      if (back_refs_position == psVar37) {
        *(size_t **)backward_references = psVar37;
        bVar53 = false;
        psVar37 = back_refs_position;
        goto LAB_00107fdf;
      }
      uVar20 = (ulong)(int)psVar13[2];
      psVar13 = psVar13 + 2;
    } while (uVar20 < uVar35);
    *(size_t **)backward_references = psVar37;
    bVar53 = psVar37 < back_refs_position;
  }
  else {
    psVar13 = num_literals + (long)psVar37 * 2;
    bVar53 = true;
  }
  if (uVar35 != uVar20) {
LAB_00107fdf:
    bVar9 = false;
    goto LAB_00107feb;
  }
  uVar38 = (uint)psVar13[1];
  local_c8 = (ulong)(int)uVar38;
  if ((uVar35 - local_c8 < uVar35) && (uVar38 <= *(uint *)((long)psVar13 + 0xc))) {
    uVar21 = uVar35 - local_c8 & ringbuffer_mask;
    if (7 < uVar19) {
      uVar14 = uVar19 & 0xfffffffffffffff8;
      local_140 = (int *)(ringbuffer + uVar14 + uVar42);
      lVar28 = 0;
      uVar42 = 0;
LAB_00107f9d:
      if (*(ulong *)(piVar2 + uVar42 * 2) == *(ulong *)(ringbuffer + uVar42 * 8 + uVar21))
      goto code_r0x00107fb3;
      uVar14 = *(ulong *)(ringbuffer + uVar42 * 8 + uVar21) ^ *(ulong *)(piVar2 + uVar42 * 2);
      uVar21 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      uVar42 = (uVar21 >> 3 & 0x1fffffff) - lVar28;
      goto LAB_00109223;
    }
    uVar14 = 0;
    local_140 = piVar2;
LAB_00109899:
    uVar20 = uVar19 & 7;
    uVar42 = uVar14;
    if (uVar20 != 0) {
      uVar36 = uVar14 | uVar20;
      do {
        uVar42 = uVar14;
        if (ringbuffer[uVar14 + uVar21] != (uint8_t)*local_140) break;
        local_140 = (int *)((long)local_140 + 1);
        uVar14 = uVar14 + 1;
        uVar20 = uVar20 - 1;
        uVar42 = uVar36;
      } while (uVar20 != 0);
    }
LAB_00109223:
    local_e0 = (ulong)*(int *)((long)num_literals + (long)psVar37 * 0x10 + 4);
    if (uVar42 < local_e0) {
      local_e0 = uVar42;
    }
    iVar11 = 0x1f;
    if (uVar38 != 0) {
      for (; uVar38 >> iVar11 == 0; iVar11 = iVar11 + -1) {
      }
    }
    local_108 = (ulong)(iVar11 * -0x1e + 0x780) + local_e0 * 0x87;
    bVar9 = false;
    bVar53 = false;
    iVar11 = 0;
    goto LAB_00108624;
  }
LAB_00109022:
  if ((psVar37 < back_refs_position) && (uVar35 == (long)(int)num_literals[(long)psVar37 * 2])) {
    uVar38 = (uint)num_literals[(long)psVar37 * 2 + 1];
    local_c8 = (ulong)(int)uVar38;
    if (*(int *)((long)num_literals + (long)psVar37 * 0x10 + 0xc) < (int)uVar38) {
      uVar41 = *(uint *)((long)num_literals + (long)psVar37 * 0x10 + 4);
      uVar14 = (ulong)uVar41;
      if (uVar41 - 4 < 0x15 && (int)uVar38 < 0x7ffffffd) {
        uVar40 = ~(uint)uVar21 + uVar38;
        lVar28 = *(long *)(literal_context_lut + 0x58);
        iVar11 = (int)uVar40 >> (*(byte *)(lVar28 + uVar14) & 0x1f);
        if (iVar11 < *(int *)(literal_context_lut + 0x60)) {
          uVar6 = *(uint *)(lVar28 + 0x20 + uVar14 * 4);
          uVar5 = kBitMask[*(byte *)(lVar28 + uVar14)];
          lVar28 = *(long *)(lVar28 + 0xa8);
          uVar16 = BrotliGetTransforms();
          pvVar17 = malloc(uVar14 * 10);
          iVar11 = BrotliTransformDictionaryWord
                             (pvVar17,(ulong)uVar6 + lVar28 + (long)(int)((uVar40 & uVar5) * uVar41)
                              ,uVar41,uVar16,iVar11);
          local_e0 = (ulong)iVar11;
          iVar12 = bcmp(piVar2,pvVar17,local_e0);
          if (iVar12 == 0) {
            iVar12 = 0x1f;
            if (uVar38 != 0) {
              for (; uVar38 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            local_108 = (ulong)(iVar12 * -0x1e + 0x780) + local_e0 * 0x87;
            iVar11 = uVar41 - iVar11;
            bVar9 = false;
            bVar53 = false;
            goto LAB_00108624;
          }
        }
      }
    }
  }
  local_118 = local_118 + 1;
  position = uVar35 + 1;
  goto LAB_0010966a;
code_r0x001080c2:
  uVar45 = uVar45 + 1;
  lVar48 = lVar48 + -8;
  piVar46 = (int *)(ringbuffer + uVar34 + uVar42);
  uVar49 = uVar34;
  if (uVar19 >> 3 == uVar45) goto LAB_0010819d;
  goto LAB_001080b0;
code_r0x00108271:
  uVar49 = uVar49 + 1;
  lVar48 = lVar48 + -8;
  piVar46 = (int *)(ringbuffer + uVar34 + uVar42);
  uVar23 = uVar34;
  if (uVar19 >> 3 == uVar49) goto LAB_00108338;
  goto LAB_0010825f;
code_r0x001084ca:
  uVar34 = uVar34 + 1;
  lVar33 = lVar33 + -8;
  if (bVar18 >> 3 == uVar34) goto code_r0x001084d6;
  goto LAB_001084b8;
code_r0x001084d6:
  pcVar24 = pcVar24 + -lVar33;
LAB_001085d9:
  uVar22 = uVar20 & 7;
  uVar34 = uVar51;
  if ((bVar18 & 7) != 0) {
    uVar15 = uVar51 | uVar22;
    do {
      uVar34 = uVar51;
      if (*(char *)((long)piVar2 + uVar51) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      uVar51 = uVar51 + 1;
      uVar22 = uVar22 - 1;
      uVar34 = uVar15;
    } while (uVar22 != 0);
  }
LAB_00108500:
  if (((uVar34 != 0) && (uVar20 < *(uint *)(literal_context_lut + 100) + uVar34)) &&
     (uVar20 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar20 - uVar34) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar20 - uVar34) * 4 << (*(byte *)(lVar48 + uVar20) & 0x3f)) +
               uVar36 + local_a0 + 1, uVar20 <= uVar14)) {
    iVar12 = 0x1f;
    if ((uint)uVar20 != 0) {
      for (; (uint)uVar20 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar36 = (uVar34 * 0x87 - (ulong)(uint)(iVar12 * 0x1e)) + 0x780;
    if (local_108 <= uVar36) {
      iVar11 = (uint)bVar18 - (int)uVar34;
      local_138 = local_138 + 1;
      *(ulong *)(lVar28 + 0x10) = local_138;
      local_108 = uVar36;
      local_e0 = uVar34;
      local_c8 = uVar20;
    }
  }
LAB_001085be:
  uVar42 = uVar42 + 1;
  bVar9 = !bVar53;
  bVar53 = false;
  if (bVar9) goto LAB_0010914c;
  goto LAB_0010845b;
LAB_0010914c:
  bVar9 = true;
  bVar53 = true;
LAB_00108624:
  if (local_108 < 0x7e5) {
LAB_00108f28:
    local_118 = local_118 + 1;
    position = uVar35 + 1;
    if (bVar9 && local_150 < position) {
      if ((uint)((int)lVar44 * 4) + local_150 < position) {
        uVar19 = uVar35 + 0x11;
        if (uVar1 - 4 <= uVar35 + 0x11) {
          uVar19 = uVar1 - 4;
        }
        if (uVar19 <= position) goto LAB_0010966a;
        lVar28 = *(long *)&params->dist;
        uVar25 = (ushort)(params->hasher).block_bits;
        do {
          uVar38 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar35 = (ulong)uVar38;
          uVar21 = position - *(uint *)(lVar28 + uVar35 * 4);
          *(char *)(lVar28 + 0x30000 + (position & 0xffff)) = (char)uVar38;
          if (0xfffe < uVar21) {
            uVar21 = 0xffff;
          }
          uVar50 = uVar25 + 1;
          *(short *)(lVar28 + 0x40000 + (ulong)uVar25 * 4) = (short)uVar21;
          *(undefined2 *)(lVar28 + 0x40002 + (ulong)uVar25 * 4) =
               *(undefined2 *)(lVar28 + 0x20000 + uVar35 * 2);
          *(int *)(lVar28 + uVar35 * 4) = (int)position;
          *(ushort *)(lVar28 + 0x20000 + uVar35 * 2) = uVar25;
          local_118 = local_118 + 4;
          position = position + 4;
          uVar25 = uVar50;
        } while (position < uVar19);
      }
      else {
        uVar19 = uVar35 + 9;
        if (uVar4 <= uVar35 + 9) {
          uVar19 = uVar4;
        }
        if (uVar19 <= position) goto LAB_0010966a;
        lVar28 = *(long *)&params->dist;
        uVar25 = (ushort)(params->hasher).block_bits;
        do {
          uVar38 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar35 = (ulong)uVar38;
          uVar21 = position - *(uint *)(lVar28 + uVar35 * 4);
          *(char *)(lVar28 + 0x30000 + (position & 0xffff)) = (char)uVar38;
          if (0xfffe < uVar21) {
            uVar21 = 0xffff;
          }
          uVar50 = uVar25 + 1;
          *(short *)(lVar28 + 0x40000 + (ulong)uVar25 * 4) = (short)uVar21;
          *(undefined2 *)(lVar28 + 0x40002 + (ulong)uVar25 * 4) =
               *(undefined2 *)(lVar28 + 0x20000 + uVar35 * 2);
          *(int *)(lVar28 + uVar35 * 4) = (int)position;
          *(ushort *)(lVar28 + 0x20000 + uVar35 * 2) = uVar25;
          local_118 = local_118 + 2;
          position = position + 2;
          uVar25 = uVar50;
        } while (position < uVar19);
      }
      *(ushort *)&(params->hasher).block_bits = uVar50;
    }
    goto LAB_0010966a;
  }
  local_138 = local_e0;
  uVar21 = local_118;
  if (bVar53) {
    uVar42 = local_118 + 4;
    uVar20 = (lVar3 + num_bytes) - uVar35;
    iVar39 = 0;
    uVar14 = uVar35;
    iVar12 = iVar11;
LAB_00108662:
    uVar36 = uVar20 >> 3;
    uVar19 = uVar19 - 1;
    uVar21 = local_e0 - 1;
    if (uVar19 <= local_e0 - 1) {
      uVar21 = uVar19;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar21 = 0;
    }
    uVar35 = uVar14 + 1;
    uVar34 = uVar32;
    if (uVar35 < uVar32) {
      uVar34 = uVar35;
    }
    local_a0 = lVar7 + uVar14 + 1;
    if (uVar32 <= local_a0) {
      local_a0 = uVar32;
    }
    uVar51 = *(ulong *)(literal_context_lut + 0x50);
    lVar28 = *(long *)&params->dist;
    uVar22 = uVar35 & ringbuffer_mask;
    iVar11 = *(int *)(ringbuffer + uVar22);
    local_148 = (int *)(ringbuffer + uVar22);
    psVar37 = *(size_t **)backward_references;
    bVar53 = true;
    if (back_refs_position <= psVar37) {
LAB_001087f5:
      uVar38 = (uint)(iVar11 * 0x1e35a7bd) >> 0x11;
      uVar49 = (ulong)uVar38;
      uVar45 = (ulong)((uint)uVar19 & 7);
      uVar15 = 0x7e4;
      lVar31 = 0;
      local_138 = 0;
      local_150 = 0;
LAB_00108834:
      uVar52 = (ulong)*(int *)((long)&(hasher->common).extra + lVar31 * 4);
      uVar23 = uVar35 - uVar52;
      cVar43 = (char)uVar38;
      if ((((lVar31 == 0) || (*(char *)(lVar28 + 0x30000 + (uVar23 & 0xffff)) == cVar43)) &&
          (uVar52 <= uVar34)) && (uVar23 < uVar35)) {
        uVar47 = uVar45;
        if (7 < uVar19) {
          lVar48 = 0;
          uVar29 = 0;
LAB_00108880:
          if (*(ulong *)(local_148 + uVar29 * 2) ==
              *(ulong *)(ringbuffer + uVar29 * 8 + (uVar23 & ringbuffer_mask)))
          goto code_r0x00108892;
          uVar47 = *(ulong *)(ringbuffer + uVar29 * 8 + (uVar23 & ringbuffer_mask)) ^
                   *(ulong *)(local_148 + uVar29 * 2);
          uVar23 = 0;
          if (uVar47 != 0) {
            for (; (uVar47 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar29 = (uVar23 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_001088c4;
        }
        uVar29 = 0;
        piVar2 = local_148;
        goto joined_r0x00108951;
      }
      goto LAB_0010892f;
    }
    uVar15 = (ulong)(int)num_literals[(long)psVar37 * 2];
    if (uVar15 < uVar35) {
      psVar13 = num_literals + (long)psVar37 * 2;
      do {
        psVar37 = (size_t *)((long)psVar37 + 1);
        if (back_refs_position == psVar37) {
          *(size_t **)backward_references = psVar37;
          psVar37 = back_refs_position;
          bVar53 = true;
          goto LAB_001087f5;
        }
        uVar15 = (ulong)(int)psVar13[2];
        psVar13 = psVar13 + 2;
      } while (uVar15 < uVar35);
      *(size_t **)backward_references = psVar37;
      bVar53 = back_refs_position <= psVar37;
    }
    else {
      psVar13 = num_literals + (long)psVar37 * 2;
      bVar53 = false;
    }
    if (uVar35 != uVar15 || bVar9) goto LAB_001087f5;
    uVar38 = (uint)psVar13[1];
    uVar21 = uVar35 - (long)(int)uVar38;
    if ((uVar35 <= uVar21) || (*(uint *)((long)psVar13 + 0xc) < uVar38)) {
      local_150 = 0;
      local_138 = 0;
      goto LAB_00108bf6;
    }
    uVar21 = uVar21 & ringbuffer_mask;
    if (uVar19 < 8) {
      uVar14 = 0;
      goto LAB_001098e2;
    }
    lVar28 = 0;
    uVar14 = 0;
    goto LAB_001097e7;
  }
LAB_001092ce:
  local_118 = uVar21;
  if (local_a0 < local_c8) {
LAB_001092d8:
    uVar21 = local_c8 + 0xf;
LAB_001092dc:
    if ((local_c8 <= local_a0) && (uVar21 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
      *(int *)&(hasher->common).extra = (int)local_c8;
    }
  }
  else {
    uVar19 = (ulong)*(int *)&(hasher->common).extra;
    if (local_c8 != uVar19) {
      uVar14 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar21 = 1;
      if (local_c8 != uVar14) {
        uVar19 = (local_c8 + 3) - uVar19;
        if (uVar19 < 7) {
          bVar18 = (byte)((int)uVar19 << 2);
          uVar38 = 0x9750468;
        }
        else {
          uVar14 = (local_c8 + 3) - uVar14;
          if (6 < uVar14) {
            uVar21 = 2;
            if ((local_c8 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar21 = 3, local_c8 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)
               )) goto LAB_001092d8;
            goto LAB_001092dc;
          }
          bVar18 = (byte)((int)uVar14 << 2);
          uVar38 = 0xfdb1ace;
        }
        uVar21 = (ulong)(uVar38 >> (bVar18 & 0x1f) & 0xf);
      }
      goto LAB_001092dc;
    }
    uVar21 = 0;
  }
  *(int *)local_b8 = (int)local_118;
  *(uint *)((long)local_b8 + 4) = iVar11 << 0x19 | (uint)local_138;
  uVar19 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  iVar12 = 0;
  if (uVar19 <= uVar21) {
    bVar18 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar14 = ((4L << (bVar18 & 0x3f)) + (uVar21 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
    uVar38 = 0x1f;
    uVar41 = (uint)uVar14;
    if (uVar41 != 0) {
      for (; uVar41 >> uVar38 == 0; uVar38 = uVar38 - 1) {
      }
    }
    uVar38 = (uVar38 ^ 0xffffffe0) + 0x1f;
    uVar42 = (ulong)((uVar14 >> ((ulong)uVar38 & 0x3f) & 1) != 0);
    lVar28 = (ulong)uVar38 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar21 = (~(-1 << (bVar18 & 0x1f)) & uVar41) + uVar19 +
             (uVar42 + lVar28 * 2 + 0xfffe << (bVar18 & 0x3f)) | lVar28 * 0x400;
    iVar12 = (int)(uVar14 - (uVar42 + 2 << ((byte)uVar38 & 0x3f)) >> (bVar18 & 0x3f));
  }
  *(short *)((long)local_b8 + 0xe) = (short)uVar21;
  *(int *)(local_b8 + 1) = iVar12;
  uVar19 = local_118;
  if (5 < local_118) {
    if (local_118 < 0x82) {
      uVar38 = 0x1f;
      uVar41 = (uint)(local_118 - 2);
      if (uVar41 != 0) {
        for (; uVar41 >> uVar38 == 0; uVar38 = uVar38 - 1) {
        }
      }
      uVar19 = (ulong)((int)(local_118 - 2 >> ((char)(uVar38 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar38 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (local_118 < 0x842) {
      uVar41 = (int)local_118 - 0x42;
      uVar38 = 0x1f;
      if (uVar41 != 0) {
        for (; uVar41 >> uVar38 == 0; uVar38 = uVar38 - 1) {
        }
      }
      uVar19 = (ulong)((uVar38 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar19 = 0x15;
      if (0x1841 < local_118) {
        uVar19 = (ulong)(ushort)(0x17 - (local_118 < 0x5842));
      }
    }
  }
  uVar38 = iVar11 + (uint)local_138;
  if (uVar38 < 10) {
    uVar41 = uVar38 - 2;
  }
  else if (uVar38 < 0x86) {
    uVar38 = uVar38 - 6;
    uVar41 = 0x1f;
    if (uVar38 != 0) {
      for (; uVar38 >> uVar41 == 0; uVar41 = uVar41 - 1) {
      }
    }
    uVar41 = (uVar38 >> ((char)(uVar41 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar41 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar41 = 0x17;
    if (uVar38 < 0x846) {
      uVar41 = 0x1f;
      if (uVar38 - 0x46 != 0) {
        for (; uVar38 - 0x46 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      uVar41 = (uVar41 ^ 0xffe0) + 0x2c;
    }
  }
  uVar25 = (ushort)uVar41;
  sVar26 = (uVar25 & 7) + ((ushort)uVar19 & 7) * 8;
  if ((((uVar21 & 0x3ff) == 0) && ((ushort)uVar19 < 8)) && (uVar25 < 0x10)) {
    if (7 < uVar25) {
      sVar26 = sVar26 + 0x40;
    }
  }
  else {
    iVar11 = (int)((uVar19 & 0xffff) >> 3) * 3 + ((uVar41 & 0xffff) >> 3);
    sVar26 = sVar26 + ((ushort)(0x520d40 >> ((char)iVar11 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar11 * 0x40 + 0x40;
  }
  *(short *)((long)local_b8 + 0xc) = sVar26;
  *num_commands = *num_commands + local_118;
  position = uVar35 + local_138;
  uVar19 = sVar27;
  if (position < sVar27) {
    uVar19 = position;
  }
  uVar21 = uVar35 + 2;
  if (local_c8 < local_138 >> 2) {
    uVar14 = position + local_c8 * -4;
    if (uVar14 < uVar21) {
      uVar14 = uVar21;
    }
    uVar21 = uVar14;
    if (uVar19 < uVar14) {
      uVar21 = uVar19;
    }
  }
  local_150 = lVar44 + local_138 * 2 + uVar35;
  local_b8 = local_b8 + 2;
  if (uVar21 < uVar19) {
    lVar28 = *(long *)&params->dist;
    uVar25 = (ushort)(params->hasher).block_bits;
    do {
      uVar38 = (uint)(*(int *)(ringbuffer + (uVar21 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar35 = (ulong)uVar38;
      uVar14 = uVar21 - *(uint *)(lVar28 + uVar35 * 4);
      *(char *)(lVar28 + 0x30000 + (uVar21 & 0xffff)) = (char)uVar38;
      if (0xfffe < uVar14) {
        uVar14 = 0xffff;
      }
      uVar50 = uVar25 + 1;
      *(short *)(lVar28 + 0x40000 + (ulong)uVar25 * 4) = (short)uVar14;
      *(undefined2 *)(lVar28 + 0x40002 + (ulong)uVar25 * 4) =
           *(undefined2 *)(lVar28 + 0x20000 + uVar35 * 2);
      *(int *)(lVar28 + uVar35 * 4) = (int)uVar21;
      *(ushort *)(lVar28 + 0x20000 + uVar35 * 2) = uVar25;
      uVar21 = uVar21 + 1;
      uVar25 = uVar50;
    } while (uVar19 != uVar21);
    *(ushort *)&(params->hasher).block_bits = uVar50;
    local_118 = 0;
  }
  else {
    local_118 = 0;
  }
LAB_0010966a:
  uVar35 = position;
  if (uVar1 <= position + 4) goto LAB_0010991c;
  goto LAB_00107e50;
code_r0x00107fb3:
  uVar42 = uVar42 + 1;
  lVar28 = lVar28 + -8;
  if (uVar19 >> 3 == uVar42) goto LAB_00109899;
  goto LAB_00107f9d;
code_r0x00108892:
  uVar29 = uVar29 + 1;
  lVar48 = lVar48 + -8;
  if (uVar36 == uVar29) goto code_r0x001088a3;
  goto LAB_00108880;
code_r0x001088a3:
  uVar29 = -lVar48;
  piVar2 = (int *)((long)local_148 - lVar48);
joined_r0x00108951:
  for (; (uVar47 != 0 && (ringbuffer[uVar29 + (uVar23 & ringbuffer_mask)] == (uint8_t)*piVar2));
      uVar29 = uVar29 + 1) {
    uVar47 = uVar47 - 1;
    piVar2 = (int *)((long)piVar2 + 1);
  }
LAB_001088c4:
  if ((!bVar53 && !bVar9) &&
     (uVar23 = (ulong)(int)num_literals[(long)psVar37 * 2], uVar23 < uVar29 + uVar35)) {
    uVar29 = uVar23 - uVar35;
  }
  if ((1 < uVar29) && (uVar23 = uVar29 * 0x87 + 0x78f, uVar15 < uVar23)) {
    if (lVar31 != 0) {
      uVar23 = uVar23 - ((0x1ca10U >> ((byte)lVar31 & 2) & 4) + 0x27);
    }
    if (uVar15 < uVar23) {
      uVar15 = uVar23;
      uVar21 = uVar29;
      local_150 = uVar52;
      local_138 = uVar29;
    }
  }
LAB_0010892f:
  lVar31 = lVar31 + 1;
  if (lVar31 == 4) goto LAB_00108985;
  goto LAB_00108834;
LAB_00108985:
  lVar31 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar23 = uVar35 - *(uint *)(lVar28 + uVar49 * 4);
  uVar25 = *(ushort *)(lVar28 + 0x20000 + uVar49 * 2);
  if (lVar31 != 0) {
    uVar47 = 0;
    uVar52 = uVar23;
    uVar50 = uVar25;
LAB_001089c8:
    uVar47 = uVar52 + uVar47;
    if (uVar47 <= uVar34) {
      if (uVar21 + uVar22 <= ringbuffer_mask) {
        uVar52 = uVar35 - uVar47 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar21 + uVar52) ||
           (ringbuffer[uVar21 + uVar22] != ringbuffer[uVar21 + uVar52])) goto LAB_00108ab9;
        uVar29 = uVar45;
        if (7 < uVar19) {
          lVar48 = 0;
          uVar30 = 0;
LAB_00108a1c:
          if (*(ulong *)(local_148 + uVar30 * 2) == *(ulong *)(ringbuffer + uVar30 * 8 + uVar52))
          goto code_r0x00108a2f;
          uVar29 = *(ulong *)(ringbuffer + uVar30 * 8 + uVar52) ^ *(ulong *)(local_148 + uVar30 * 2)
          ;
          uVar52 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
            }
          }
          uVar30 = (uVar52 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_00108a67;
        }
        uVar30 = 0;
        piVar2 = local_148;
        goto joined_r0x00108af1;
      }
      goto LAB_00108ab9;
    }
  }
LAB_00108b19:
  uVar50 = (ushort)(params->hasher).block_bits;
  *(ushort *)&(params->hasher).block_bits = uVar50 + 1;
  *(char *)(lVar28 + 0x30000 + (uVar35 & 0xffff)) = cVar43;
  if (0xfffe < uVar23) {
    uVar23 = 0xffff;
  }
  *(short *)(lVar28 + 0x40000 + (ulong)uVar50 * 4) = (short)uVar23;
  *(ushort *)(lVar28 + 0x40002 + (ulong)uVar50 * 4) = uVar25;
  *(int *)(lVar28 + uVar49 * 4) = (int)uVar35;
  *(ushort *)(lVar28 + 0x20000 + uVar49 * 2) = uVar50;
  if (uVar15 == 0x7e4) {
    if (bVar9) {
      lVar28 = *(long *)&(params->dist).alphabet_size_max;
      uVar21 = *(ulong *)(lVar28 + 8);
      local_b0 = *(ulong *)(lVar28 + 0x10);
      uVar15 = 0x7e4;
      if (uVar21 >> 7 <= local_b0) {
        uVar36 = (ulong)((uint)(*local_148 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar31 = *(long *)(literal_context_lut + 0x78);
        iVar11 = 0;
        uVar15 = 0x7e4;
        bVar53 = true;
LAB_00108d27:
        uVar21 = uVar21 + 1;
        *(ulong *)(lVar28 + 8) = uVar21;
        bVar18 = *(byte *)(lVar31 + uVar36);
        uVar34 = (ulong)bVar18;
        if ((uVar34 != 0) && (uVar34 <= uVar19)) {
          uVar22 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar36 * 2);
          lVar48 = *(long *)(literal_context_lut + 0x58);
          pcVar24 = (char *)(uVar22 * uVar34 + *(long *)(lVar48 + 0xa8) +
                            (ulong)*(uint *)(lVar48 + 0x20 + uVar34 * 4));
          if (7 < bVar18) {
            uVar45 = (ulong)(bVar18 & 0xfffffff8);
            lVar33 = 0;
            uVar49 = 0;
LAB_00108d96:
            if (*(ulong *)(pcVar24 + uVar49 * 8) == *(ulong *)(local_148 + uVar49 * 2))
            goto code_r0x00108da8;
            uVar49 = *(ulong *)(local_148 + uVar49 * 2) ^ *(ulong *)(pcVar24 + uVar49 * 8);
            uVar45 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
              }
            }
            uVar49 = (uVar45 >> 3 & 0x1fffffff) - lVar33;
            goto LAB_00108dda;
          }
          uVar45 = 0;
          goto LAB_00108eec;
        }
        goto LAB_00108ec6;
      }
      iVar11 = 0;
    }
    else {
      psVar37 = *(size_t **)backward_references;
LAB_00108bf6:
      uVar15 = 0x7e4;
      if ((psVar37 < back_refs_position) && (uVar35 == (long)(int)num_literals[(long)psVar37 * 2]))
      {
        iVar8 = (int)num_literals[(long)psVar37 * 2 + 1];
        if (*(int *)((long)num_literals + (long)psVar37 * 0x10 + 0xc) < iVar8) {
          uVar38 = *(uint *)((long)num_literals + (long)psVar37 * 0x10 + 4);
          uVar19 = (ulong)uVar38;
          iVar11 = 0;
          local_c8 = local_150;
          if (uVar38 - 4 < 0x15 && iVar8 < 0x7ffffffd) {
            uVar41 = ~(uint)uVar34 + iVar8;
            lVar28 = *(long *)(literal_context_lut + 0x58);
            if ((int)uVar41 >> (*(byte *)(lVar28 + uVar19) & 0x1f) <
                *(int *)(literal_context_lut + 0x60)) {
              uVar40 = *(uint *)(lVar28 + 0x20 + uVar19 * 4);
              uVar6 = kBitMask[*(byte *)(lVar28 + uVar19)];
              lVar28 = *(long *)(lVar28 + 0xa8);
              uVar16 = BrotliGetTransforms();
              pvVar17 = malloc(uVar19 * 10);
              iVar12 = BrotliTransformDictionaryWord
                                 (pvVar17,(ulong)uVar40 + lVar28 +
                                          (long)(int)((uVar41 & uVar6) * uVar38),uVar38,uVar16);
              iVar39 = bcmp(local_148,pvVar17,(long)iVar12);
              local_c8 = local_150;
              if (iVar39 == 0) {
                iVar11 = uVar38 - iVar12;
                local_138 = (long)iVar12;
                local_c8 = (long)iVar8;
              }
            }
          }
          goto LAB_0010987a;
        }
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
      }
    }
  }
  else {
    iVar11 = 0;
  }
LAB_00108c4f:
  if (uVar15 < local_108 + 0xaf) {
    local_138 = local_e0;
    uVar35 = uVar14;
    uVar21 = local_118;
    local_a0 = uVar14 + lVar7;
    iVar11 = iVar12;
    if (uVar32 <= uVar14 + lVar7) {
      local_a0 = uVar32;
    }
    goto LAB_001092ce;
  }
  local_c8 = local_150;
  uVar21 = uVar42;
  if (iVar39 == 3) goto LAB_001092ce;
  local_118 = local_118 + 1;
  iVar39 = iVar39 + 1;
  uVar36 = uVar14 + 5;
  uVar20 = uVar20 - 1;
  local_e0 = local_138;
  uVar14 = uVar35;
  uVar21 = local_118;
  local_108 = uVar15;
  iVar12 = iVar11;
  if (uVar1 <= uVar36) goto LAB_001092ce;
  goto LAB_00108662;
code_r0x00108a2f:
  uVar30 = uVar30 + 1;
  lVar48 = lVar48 + -8;
  if (uVar36 == uVar30) goto code_r0x00108a40;
  goto LAB_00108a1c;
code_r0x00108a40:
  uVar30 = -lVar48;
  piVar2 = (int *)((long)local_148 - lVar48);
joined_r0x00108af1:
  for (; (uVar29 != 0 && (ringbuffer[uVar30 + uVar52] == (uint8_t)*piVar2)); uVar30 = uVar30 + 1) {
    uVar29 = uVar29 - 1;
    piVar2 = (int *)((long)piVar2 + 1);
  }
LAB_00108a67:
  if ((!bVar53 && !bVar9) &&
     (uVar52 = (ulong)(int)num_literals[(long)psVar37 * 2], uVar52 < uVar30 + uVar35)) {
    uVar30 = uVar52 - uVar35;
  }
  if (3 < uVar30) {
    iVar11 = 0x1f;
    if ((uint)uVar47 != 0) {
      for (; (uint)uVar47 >> iVar11 == 0; iVar11 = iVar11 + -1) {
      }
    }
    uVar52 = (ulong)(iVar11 * -0x1e + 0x780) + uVar30 * 0x87;
    if (uVar15 < uVar52) {
      uVar15 = uVar52;
      uVar21 = uVar30;
      local_150 = uVar47;
      local_138 = uVar30;
    }
  }
LAB_00108ab9:
  uVar52 = (ulong)uVar50;
  uVar50 = *(ushort *)(lVar28 + 0x40002 + uVar52 * 4);
  uVar52 = (ulong)*(ushort *)(lVar28 + 0x40000 + uVar52 * 4);
  lVar31 = lVar31 + -1;
  if (lVar31 == 0) goto LAB_00108b19;
  goto LAB_001089c8;
code_r0x00108da8:
  uVar49 = uVar49 + 1;
  lVar33 = lVar33 + -8;
  if (bVar18 >> 3 == uVar49) goto code_r0x00108db4;
  goto LAB_00108d96;
code_r0x00108db4:
  pcVar24 = pcVar24 + -lVar33;
LAB_00108eec:
  uVar23 = uVar34 & 7;
  uVar49 = uVar45;
  if ((bVar18 & 7) != 0) {
    uVar52 = uVar45 | uVar23;
    do {
      uVar49 = uVar45;
      if (*(char *)((long)local_148 + uVar45) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      uVar45 = uVar45 + 1;
      uVar23 = uVar23 - 1;
      uVar49 = uVar52;
    } while (uVar23 != 0);
  }
LAB_00108dda:
  if (((uVar49 != 0) && (uVar34 < *(uint *)(literal_context_lut + 100) + uVar49)) &&
     (uVar34 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar34 - uVar49) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar34 - uVar49) * 4 << (*(byte *)(lVar48 + uVar34) & 0x3f)) +
               uVar22 + local_a0 + 1, uVar34 <= uVar51)) {
    iVar8 = 0x1f;
    if ((uint)uVar34 != 0) {
      for (; (uint)uVar34 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    uVar22 = (uVar49 * 0x87 - (ulong)(uint)(iVar8 * 0x1e)) + 0x780;
    if (uVar15 <= uVar22) {
      iVar11 = (uint)bVar18 - (int)uVar49;
      local_b0 = local_b0 + 1;
      *(ulong *)(lVar28 + 0x10) = local_b0;
      uVar15 = uVar22;
      local_150 = uVar34;
      local_138 = uVar49;
    }
  }
LAB_00108ec6:
  uVar36 = uVar36 + 1;
  bVar10 = !bVar53;
  bVar53 = false;
  if (bVar10) goto LAB_00108c4f;
  goto LAB_00108d27;
LAB_001097e7:
  if (*(ulong *)(ringbuffer + uVar14 * 8 + uVar22) == *(ulong *)(ringbuffer + uVar14 * 8 + uVar21))
  goto code_r0x001097f4;
  uVar21 = *(ulong *)(ringbuffer + uVar14 * 8 + uVar21) ^
           *(ulong *)(ringbuffer + uVar14 * 8 + uVar22);
  uVar19 = 0;
  if (uVar21 != 0) {
    for (; (uVar21 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
    }
  }
  uVar14 = (uVar19 >> 3 & 0x1fffffff) - lVar28;
  goto LAB_00109825;
code_r0x001097f4:
  uVar14 = uVar14 + 1;
  lVar28 = lVar28 + -8;
  if (uVar36 == uVar14) goto code_r0x00109805;
  goto LAB_001097e7;
code_r0x00109805:
  local_148 = (int *)(ringbuffer + (uVar22 - lVar28));
  uVar14 = -lVar28;
LAB_001098e2:
  uVar19 = uVar19 & 7;
  for (; (uVar19 != 0 && (ringbuffer[uVar14 + uVar21] == (uint8_t)*local_148)); uVar14 = uVar14 + 1)
  {
    local_148 = (int *)((long)local_148 + 1);
    uVar19 = uVar19 - 1;
  }
LAB_00109825:
  local_138 = (ulong)*(int *)((long)num_literals + (long)psVar37 * 0x10 + 4);
  if (uVar14 < local_138) {
    local_138 = uVar14;
  }
  iVar11 = 0;
  local_c8 = (long)(int)uVar38;
LAB_0010987a:
  uVar21 = local_118 + 1;
  goto LAB_001092ce;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}